

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

int __thiscall Liby::Socket::accept(Socket *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  int iVar1;
  int *piVar2;
  undefined8 *puVar3;
  char *pcVar4;
  sockaddr *__addr_00;
  undefined4 in_register_00000034;
  uchar this_00 [8];
  Endpoint local_50;
  shared_ptr<Liby::FileDescriptor> local_48;
  int local_34;
  int local_30;
  int i;
  int clfd;
  socklen_t address_len;
  sockaddr_in address;
  Socket *this_local;
  
  this_00._4_4_ = in_register_00000034;
  this_00._0_4_ = __fd;
  address.sin_zero = this_00;
  iVar1 = fd((Socket *)this_00);
  if (iVar1 < 0) {
    __assert_fail("fd() >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Socket.cpp"
                  ,0xd,"SockPtr Liby::Socket::accept()");
  }
  i = 0x10;
  iVar1 = fd((Socket *)this_00);
  local_30 = ::accept(iVar1,(sockaddr *)&clfd,(socklen_t *)&i);
  if (local_30 < 0) {
    piVar2 = __errno_location();
    if (*piVar2 == 0xb) {
      std::shared_ptr<Liby::Socket>::shared_ptr((shared_ptr<Liby::Socket> *)this,(nullptr_t)0x0);
    }
    else {
      piVar2 = __errno_location();
      if (*piVar2 != 4) {
        piVar2 = __errno_location();
        local_34 = *piVar2;
        ClearUnuseVariableWarning<int&>(&local_34);
        puVar3 = (undefined8 *)__cxa_allocate_exception(8);
        piVar2 = __errno_location();
        pcVar4 = strerror(*piVar2);
        *puVar3 = pcVar4;
        __cxa_throw(puVar3,&char*::typeinfo,0);
      }
      accept(this,__fd,__addr_00,__addr_len);
    }
  }
  else {
    std::make_shared<Liby::FileDescriptor,int&>((int *)&local_48);
    Endpoint::Endpoint(&local_50,(sockaddr_in *)&clfd);
    std::make_shared<Liby::Socket,std::shared_ptr<Liby::FileDescriptor>,Liby::Endpoint>
              ((shared_ptr<Liby::FileDescriptor> *)this,(Endpoint *)&local_48);
    std::shared_ptr<Liby::FileDescriptor>::~shared_ptr(&local_48);
  }
  return (int)this;
}

Assistant:

SockPtr Socket::accept() {
    assert(fd() >= 0);

    struct sockaddr_in address;
    // remember to init address_len
    socklen_t address_len = sizeof(address);
    int clfd = ::accept(fd(), (struct sockaddr *)&address, &address_len);
    if (clfd < 0) {
        if (errno == EAGAIN) {
            return nullptr;
        } else if (errno == EINTR) {
            return accept();
        } else {
            auto i = errno;
            ClearUnuseVariableWarning(i);
            throw ::strerror(errno);
        }
    } else {
        return std::make_shared<Socket>(
            std::make_shared<FileDescriptor>(clfd),
            Endpoint((struct sockaddr_in *)(&address)));
    }
}